

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O0

void __thiscall
Diligent::anon_unknown_77::BindResourceHelper::CacheImage
          (BindResourceHelper *this,BindResourceInfo *BindInfo)

{
  BindResourceInfo *this_00;
  undefined *puVar1;
  bool bVar2;
  Char *pCVar3;
  TextureViewVkImpl *BindInfo_00;
  IDeviceObject *pIVar4;
  PipelineResourceSignatureDesc *pPVar5;
  ISampler *pIVar6;
  TextureViewDesc *pTVar7;
  undefined8 uVar8;
  PipelineResourceDesc *Args;
  PipelineResourceDesc *pPVar9;
  initializer_list<Diligent::TEXTURE_VIEW_TYPE> ExpectedViewTypes;
  undefined8 in_stack_fffffffffffffce8;
  uint uVar10;
  char (*Args_4) [38];
  IDeviceObject *pCachedView;
  char *in_stack_fffffffffffffd00;
  char (*in_stack_fffffffffffffd08) [20];
  code *pcVar11;
  Uint32 local_2d4;
  undefined1 local_211;
  String local_210;
  undefined1 local_1f0 [8];
  string _msg_1;
  undefined1 local_1b0 [8];
  BindResourceHelper BindSeparateSampler;
  string msg_5;
  ISampler *pSampler;
  string msg_4;
  PipelineResourceAttribsVk *SamplerAttribs;
  PipelineResourceDesc *SamplerResDesc;
  string msg_3;
  string msg_2;
  undefined1 local_b8 [8];
  string _msg;
  TextureViewVkImpl *pTexViewVk;
  TextureViewVkImpl *local_88;
  ulong local_80;
  TEXTURE_VIEW_TYPE local_71;
  TEXTURE_VIEW_TYPE RequiredViewType;
  RefCntAutoPtr<Diligent::TextureViewVkImpl> pTexViewVk0;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  BindResourceInfo *BindInfo_local;
  BindResourceHelper *this_local;
  
  uVar10 = (uint)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  msg.field_2._8_8_ = BindInfo;
  if (BindInfo->pObject == (IDeviceObject *)0x0) {
    FormatString<char[67]>
              ((string *)local_38,
               (char (*) [67])"Setting image to null is handled by BindResourceHelper::operator()");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CacheImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x1f8);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (((this->m_DstRes->Type != StorageImage) && (this->m_DstRes->Type != SeparateImage)) &&
     (this->m_DstRes->Type != CombinedImageSampler)) {
    FormatString<char[68]>
              ((string *)&pTexViewVk0,
               (char (*) [68])"Storage image, separate image or sampled image resource is expected")
    ;
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CacheImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x1fc);
    std::__cxx11::string::~string((string *)&pTexViewVk0);
  }
  RefCntAutoPtr<Diligent::TextureViewVkImpl>::RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::TextureViewVkImpl> *)&stack0xffffffffffffff90,
             *(IObject **)msg.field_2._8_8_,(INTERFACE_ID *)IID_TextureViewVk);
  local_71 = DvpDescriptorTypeToTextureView(this->m_DstRes->Type);
  uVar8 = msg.field_2._8_8_;
  pPVar9 = this->m_ResDesc;
  BindInfo_00 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::RawPtr
                          ((RefCntAutoPtr<Diligent::TextureViewVkImpl> *)&stack0xffffffffffffff90);
  pTexViewVk._7_1_ = local_71;
  local_88 = (TextureViewVkImpl *)((long)&pTexViewVk + 7);
  local_80 = 1;
  pIVar4 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr(&this->m_DstRes->pObject);
  pPVar5 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                      *)this->m_Signature);
  pCachedView = (IDeviceObject *)(pPVar5->super_DeviceObjectAttribs).Name;
  Args_4 = (char (*) [38])((ulong)uVar10 << 0x20);
  ExpectedViewTypes._M_len = 0;
  ExpectedViewTypes._M_array = (iterator)local_80;
  VerifyResourceViewBinding<Diligent::TextureViewVkImpl,Diligent::TEXTURE_VIEW_TYPE>
            ((Diligent *)pPVar9,(PipelineResourceDesc *)uVar8,(BindResourceInfo *)BindInfo_00,
             local_88,ExpectedViewTypes,RESOURCE_DIM_UNDEFINED,SUB81(pIVar4,0),pCachedView,
             in_stack_fffffffffffffd00);
  _msg.field_2._8_8_ =
       Diligent::RefCntAutoPtr::operator_cast_to_TextureViewVkImpl_
                 ((RefCntAutoPtr *)&stack0xffffffffffffff90);
  bVar2 = UpdateCachedResource<Diligent::TextureViewVkImpl>
                    (this,(RefCntAutoPtr<Diligent::TextureViewVkImpl> *)&stack0xffffffffffffff90,
                     *(SET_SHADER_RESOURCE_FLAGS *)(msg.field_2._8_8_ + 8),0,0);
  if (bVar2) {
    if (((this->m_DstRes->Type == CombinedImageSampler) &&
        (bVar2 = PipelineResourceAttribsVk::IsImmutableSamplerAssigned(this->m_Attribs), !bVar2)) &&
       (pIVar6 = TextureViewBase<Diligent::EngineVkImplTraits>::GetSampler
                           ((TextureViewBase<Diligent::EngineVkImplTraits> *)_msg.field_2._8_8_),
       pIVar6 == (ISampler *)0x0)) {
      pTVar7 = DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
               ::GetDesc((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                          *)_msg.field_2._8_8_);
      GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                ((String *)((long)&msg_2.field_2 + 8),this->m_ResDesc,this->m_ArrayIndex);
      FormatString<char[29],char_const*,char[16],std::__cxx11::string,char[38]>
                ((string *)local_b8,(Diligent *)"Error binding texture view \'",
                 (char (*) [29])pTVar7,(char **)"\' to variable \'",
                 (char (*) [16])((long)&msg_2.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\'. No sampler is assigned to the view",Args_4);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar8 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar8,0);
      }
      std::__cxx11::string::~string((string *)local_b8);
    }
    bVar2 = PipelineResourceAttribsVk::IsCombinedWithSampler(this->m_Attribs);
    if (bVar2) {
      if (this->m_DstRes->Type != SeparateImage) {
        FormatString<char[96]>
                  ((string *)((long)&msg_3.field_2 + 8),
                   (char (*) [96])
                   "Only separate images can be assigned separate samplers when using HLSL-style combined samplers."
                  );
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"CacheImage",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                   ,0x21d);
        std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      }
      bVar2 = PipelineResourceAttribsVk::IsImmutableSamplerAssigned(this->m_Attribs);
      if (bVar2) {
        FormatString<char[55]>
                  ((string *)&SamplerResDesc,
                   (char (*) [55])"Separate image can\'t be assigned an immutable sampler.");
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"CacheImage",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                   ,0x21e);
        std::__cxx11::string::~string((string *)&SamplerResDesc);
      }
      Args = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                       (&this->m_Signature->
                         super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                        (uint)*(ushort *)&this->m_Attribs->field_0x2);
      pPVar9 = Args;
      msg_4.field_2._8_8_ =
           PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                     (&this->m_Signature->
                       super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                      (uint)*(ushort *)&this->m_Attribs->field_0x2);
      if (Args->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
        FormatString<char[26],char[60]>
                  ((string *)&pSampler,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SamplerResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER",
                   (char (*) [60])pPVar9);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"CacheImage",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                   ,0x222);
        std::__cxx11::string::~string((string *)&pSampler);
      }
      bVar2 = PipelineResourceAttribsVk::IsImmutableSamplerAssigned
                        ((PipelineResourceAttribsVk *)msg_4.field_2._8_8_);
      if (!bVar2) {
        pIVar6 = TextureViewBase<Diligent::EngineVkImplTraits>::GetSampler
                           ((TextureViewBase<Diligent::EngineVkImplTraits> *)_msg.field_2._8_8_);
        if (pIVar6 == (ISampler *)0x0) {
          GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                    (&local_210,this->m_ResDesc,this->m_ArrayIndex);
          pTVar7 = DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                   ::GetDesc((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                              *)_msg.field_2._8_8_);
          local_211 = 0x27;
          FormatString<char[45],char_const*,char[31],std::__cxx11::string,char[39],char_const*,char>
                    ((string *)local_1f0,(Diligent *)"Failed to bind sampler to sampler variable \'"
                     ,(char (*) [45])Args,(char **)"\' assigned to separate image \'",
                     (char (*) [31])&local_210,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\': no sampler is set in texture view \'",(char (*) [39])pTVar7,
                     (char **)&local_211,(char *)pCachedView);
          std::__cxx11::string::~string((string *)&local_210);
          if (DebugMessageCallback != (undefined *)0x0) {
            pcVar11 = (code *)DebugMessageCallback;
            uVar8 = std::__cxx11::string::c_str();
            (*pcVar11)(2,uVar8,0);
          }
          std::__cxx11::string::~string((string *)local_1f0);
        }
        else {
          if ((Args->ArraySize != 1) && (Args->ArraySize != this->m_ResDesc->ArraySize)) {
            FormatString<char[13],unsigned_int,char[33],char_const*,char[46],unsigned_int,char[31],char_const*,char[20]>
                      ((string *)&BindSeparateSampler.m_DstRes,(Diligent *)"Array size (",
                       (char (*) [13])&Args->ArraySize,(uint *)") of separate sampler variable \'",
                       (char (*) [33])Args,(char **)"\' must be one or the same as the array size ("
                       ,(char (*) [46])&this->m_ResDesc->ArraySize,
                       (uint *)") of separate image variable \'",(char (*) [31])this->m_ResDesc,
                       (char **)"\' it is assigned to",in_stack_fffffffffffffd08);
            pCVar3 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar3,"CacheImage",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                       ,0x22d);
            std::__cxx11::string::~string((string *)&BindSeparateSampler.m_DstRes);
          }
          if (Args->ArraySize == 1) {
            local_2d4 = 0;
          }
          else {
            local_2d4 = this->m_ArrayIndex;
          }
          BindResourceHelper((BindResourceHelper *)local_1b0,this->m_Signature,this->m_ResourceCache
                             ,(uint)((ulong)*(undefined8 *)this->m_Attribs >> 0x10) & 0xffff,
                             local_2d4);
          this_00 = (BindResourceInfo *)((long)&_msg_1.field_2 + 8);
          BindResourceInfo::BindResourceInfo
                    (this_00,(Uint32)BindSeparateSampler.m_ResourceCache,
                     &pIVar6->super_IDeviceObject,
                     *(SET_SHADER_RESOURCE_FLAGS *)(msg.field_2._8_8_ + 8),0,0);
          operator()((BindResourceHelper *)local_1b0,this_00);
        }
      }
    }
  }
  RefCntAutoPtr<Diligent::TextureViewVkImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::TextureViewVkImpl> *)&stack0xffffffffffffff90);
  return;
}

Assistant:

void BindResourceHelper::CacheImage(const BindResourceInfo& BindInfo) const
{
    VERIFY(BindInfo.pObject != nullptr, "Setting image to null is handled by BindResourceHelper::operator()");
    VERIFY((m_DstRes.Type == DescriptorType::StorageImage ||
            m_DstRes.Type == DescriptorType::SeparateImage ||
            m_DstRes.Type == DescriptorType::CombinedImageSampler),
           "Storage image, separate image or sampled image resource is expected");

    RefCntAutoPtr<TextureViewVkImpl> pTexViewVk0{BindInfo.pObject, IID_TextureViewVk};
#ifdef DILIGENT_DEVELOPMENT
    {
        // HLSL buffer SRVs are mapped to storage buffers in GLSL
        TEXTURE_VIEW_TYPE RequiredViewType = DvpDescriptorTypeToTextureView(m_DstRes.Type);
        VerifyResourceViewBinding(m_ResDesc, BindInfo, pTexViewVk0.RawPtr(),
                                  {RequiredViewType},
                                  RESOURCE_DIM_UNDEFINED, // Required resource dimension is not known
                                  false,                  // IsMultisample (ignored when resource dim is unknown)
                                  m_DstRes.pObject.RawPtr(),
                                  m_Signature.GetDesc().Name);
    }
#endif

    TextureViewVkImpl* pTexViewVk = pTexViewVk0;
    if (UpdateCachedResource(std::move(pTexViewVk0), BindInfo.Flags))
    {
#ifdef DILIGENT_DEVELOPMENT
        if (m_DstRes.Type == DescriptorType::CombinedImageSampler && !m_Attribs.IsImmutableSamplerAssigned())
        {
            if (pTexViewVk->GetSampler() == nullptr)
            {
                LOG_ERROR_MESSAGE("Error binding texture view '", pTexViewVk->GetDesc().Name, "' to variable '",
                                  GetShaderResourcePrintName(m_ResDesc, m_ArrayIndex), "'. No sampler is assigned to the view");
            }
        }
#endif

        if (m_Attribs.IsCombinedWithSampler())
        {
            VERIFY(m_DstRes.Type == DescriptorType::SeparateImage,
                   "Only separate images can be assigned separate samplers when using HLSL-style combined samplers.");
            VERIFY(!m_Attribs.IsImmutableSamplerAssigned(), "Separate image can't be assigned an immutable sampler.");

            const PipelineResourceDesc&      SamplerResDesc = m_Signature.GetResourceDesc(m_Attribs.SamplerInd);
            const PipelineResourceAttribsVk& SamplerAttribs = m_Signature.GetResourceAttribs(m_Attribs.SamplerInd);
            VERIFY_EXPR(SamplerResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER);

            if (!SamplerAttribs.IsImmutableSamplerAssigned())
            {
                if (ISampler* pSampler = pTexViewVk->GetSampler())
                {
                    DEV_CHECK_ERR(SamplerResDesc.ArraySize == 1 || SamplerResDesc.ArraySize == m_ResDesc.ArraySize,
                                  "Array size (", SamplerResDesc.ArraySize,
                                  ") of separate sampler variable '",
                                  SamplerResDesc.Name,
                                  "' must be one or the same as the array size (", m_ResDesc.ArraySize,
                                  ") of separate image variable '", m_ResDesc.Name, "' it is assigned to");

                    BindResourceHelper BindSeparateSampler{
                        m_Signature,
                        m_ResourceCache,
                        m_Attribs.SamplerInd,
                        SamplerResDesc.ArraySize == 1 ? 0 : m_ArrayIndex};
                    BindSeparateSampler(BindResourceInfo{BindSeparateSampler.m_ArrayIndex, pSampler, BindInfo.Flags});
                }
                else
                {
                    LOG_ERROR_MESSAGE("Failed to bind sampler to sampler variable '", SamplerResDesc.Name,
                                      "' assigned to separate image '", GetShaderResourcePrintName(m_ResDesc, m_ArrayIndex),
                                      "': no sampler is set in texture view '", pTexViewVk->GetDesc().Name, '\'');
                }
            }
        }
    }
}